

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O1

int SaveEXR(float *rgb,int width,int height,char *outfilename)

{
  int iVar1;
  char *__dest;
  void *pvVar2;
  void *__ptr;
  undefined8 uVar3;
  long lVar4;
  size_type sVar5;
  float *pfVar6;
  size_type __new_size;
  char *err;
  vector<float,_std::allocator<float>_> images [3];
  EXRImage image;
  float *image_ptr [3];
  EXRHeader header;
  code *pcStack_10960;
  char *pcStack_10958;
  char *pcStack_10950;
  vector<float,_std::allocator<float>_> vStack_10948;
  vector<float,_std::allocator<float>_> vStack_10930;
  vector<float,_std::allocator<float>_> vStack_10918;
  EXRImage EStack_108f8;
  pointer pfStack_108d8;
  pointer pfStack_108d0;
  pointer pfStack_108c8;
  EXRHeader EStack_108b8;
  
  pcStack_10960 = (code *)0x12c7f5;
  pcStack_10958 = outfilename;
  memset(&EStack_108b8,0,0x10890);
  EStack_108f8.width = 0;
  EStack_108f8.tiles = (EXRTile *)0x0;
  EStack_108f8.images._0_4_ = 0;
  EStack_108f8.images._4_4_ = 0;
  EStack_108f8.height = 0;
  EStack_108f8.num_channels = 3;
  vStack_10918.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_10918.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_10930.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_10930.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_10948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_10930.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_10948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_10948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_10918.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __new_size = (size_type)(height * width);
  pcStack_10960 = (code *)0x12c838;
  std::vector<float,_std::allocator<float>_>::resize(&vStack_10948,__new_size);
  pcStack_10960 = (code *)0x12c845;
  std::vector<float,_std::allocator<float>_>::resize(&vStack_10930,__new_size);
  pcStack_10960 = (code *)0x12c852;
  std::vector<float,_std::allocator<float>_>::resize(&vStack_10918,__new_size);
  if (0 < height * width) {
    pfVar6 = rgb + 2;
    sVar5 = 0;
    do {
      vStack_10948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[sVar5] = pfVar6[-2];
      vStack_10930.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[sVar5] = pfVar6[-1];
      vStack_10918.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[sVar5] = *pfVar6;
      sVar5 = sVar5 + 1;
      pfVar6 = pfVar6 + 3;
    } while (__new_size != sVar5);
  }
  if (((vStack_10918.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_10918.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start) &&
      (pfStack_108d8 =
            vStack_10918.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start,
      vStack_10930.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      vStack_10930.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start)) &&
     (pfStack_108d0 =
           vStack_10930.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start,
     vStack_10948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish !=
     vStack_10948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start)) {
    EStack_108f8.images = (uchar **)&pfStack_108d8;
    pfStack_108c8 =
         vStack_10948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    EStack_108f8.height = height;
    pcStack_10960 = (code *)0x12c906;
    EStack_108f8.width = width;
    __dest = (char *)malloc(0x330);
    pcStack_10960 = (code *)0x12c925;
    strncpy(__dest,"B",0xff);
    __dest[1] = '\0';
    pcStack_10960 = (code *)0x12c943;
    strncpy(__dest + 0x110,"G",0xff);
    __dest[0x111] = '\0';
    pcStack_10960 = (code *)0x12c962;
    strncpy(__dest + 0x220,"R",0xff);
    __dest[0x221] = '\0';
    pcStack_10960 = (code *)0x12c973;
    pvVar2 = malloc(0xc);
    pcStack_10960 = (code *)0x12c988;
    __ptr = malloc(0xc);
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pvVar2 + lVar4 * 4) = 2;
      *(undefined4 *)((long)__ptr + lVar4 * 4) = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    pcStack_10950 = (char *)0x0;
    pcStack_10960 = (code *)0x12c9d7;
    iVar1 = SaveEXRImageToFile(&EStack_108f8,&EStack_108b8,pcStack_10958,&pcStack_10950);
    if (iVar1 == 0) {
      pcStack_10960 = (code *)0x12c9f3;
      github111116::ConsoleLogger::info<char[16],char_const*>
                (&console,(char (*) [16])"Saved exr file ",&pcStack_10958);
      pcStack_10960 = (code *)0x12ca00;
      free(__dest);
      pcStack_10960 = (code *)0x12ca0d;
      free(pvVar2);
      pcStack_10960 = (code *)0x12ca1a;
      free(__ptr);
      iVar1 = 0;
    }
    else {
      pcStack_10960 = (code *)0x12ca5b;
      SaveEXR();
    }
    lVar4 = 0x48;
    do {
      pvVar2 = *(void **)((long)&pcStack_10960 + lVar4);
      if (pvVar2 != (void *)0x0) {
        pcStack_10960 = (code *)0x12ca39;
        operator_delete(pvVar2,*(long *)((long)&pcStack_10950 + lVar4) - (long)pvVar2);
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
    return iVar1;
  }
  pcStack_10960 = (code *)0x12ca6f;
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  lVar4 = 0x48;
  do {
    pvVar2 = *(void **)((long)&pcStack_10960 + lVar4);
    if (pvVar2 != (void *)0x0) {
      pcStack_10960 = (code *)0x12ca93;
      operator_delete(pvVar2,*(long *)((long)&pcStack_10950 + lVar4) - (long)pvVar2);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  pcStack_10960 = tinyexr::miniz::tdefl_compress_block;
  _Unwind_Resume(uVar3);
}

Assistant:

int SaveEXR(const float* rgb, int width, int height, const char* outfilename) {

  EXRHeader header;
  InitEXRHeader(&header);

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = 3;

  std::vector<float> images[3];
  images[0].resize(width * height);
  images[1].resize(width * height);
  images[2].resize(width * height);

  // Split RGBRGBRGB... into R, G and B layer
  for (int i = 0; i < width * height; i++) {
    images[0][i] = rgb[3*i+0];
    images[1][i] = rgb[3*i+1];
    images[2][i] = rgb[3*i+2];
  }

  float* image_ptr[3];
  image_ptr[0] = &(images[2].at(0)); // B
  image_ptr[1] = &(images[1].at(0)); // G
  image_ptr[2] = &(images[0].at(0)); // R

  image.images = (unsigned char**)image_ptr;
  image.width = width;
  image.height = height;

  header.num_channels = 3;
  header.channels = (EXRChannelInfo *)malloc(sizeof(EXRChannelInfo) * header.num_channels);
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  strncpy(header.channels[0].name, "B", 255); header.channels[0].name[strlen("B")] = '\0';
  strncpy(header.channels[1].name, "G", 255); header.channels[1].name[strlen("G")] = '\0';
  strncpy(header.channels[2].name, "R", 255); header.channels[2].name[strlen("R")] = '\0';

  header.pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  header.requested_pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT; // pixel type of input image
    header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_HALF; // pixel type of output image to be stored in .EXR
  }

  const char* err = NULL; // or nullptr in C++11 or later.
  int ret = SaveEXRImageToFile(&image, &header, outfilename, &err);
  if (ret != TINYEXR_SUCCESS) {
    fprintf(stderr, "Save EXR err: %s\n", err);
    // FreeEXRErrorMessage(err); // free's buffer for an error message
    return ret;
  }
  console.info("Saved exr file ", outfilename);

  // free(rgb);

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return TINYEXR_SUCCESS;
}